

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpWriter.cpp
# Opt level: O3

string * __thiscall
OpenMD::DumpWriter::prepareDumpLine_abi_cxx11_
          (string *__return_storage_ptr__,DumpWriter *this,StuntDouble *sd)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  DataStoragePointer DVar9;
  size_t sVar10;
  Snapshot *pSVar11;
  long lVar12;
  string line;
  string type;
  char tempBuffer [4096];
  undefined1 *local_10a0;
  undefined8 local_1098;
  undefined1 local_1090;
  undefined7 uStack_108f;
  long *local_1080 [2];
  long local_1070 [2];
  ulong local_1060;
  Quaternion<double> local_1058;
  char local_1038 [4104];
  
  uVar7 = sd->globalIntegrableObjectIndex_;
  local_1080[0] = local_1070;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1080,"pv","");
  local_10a0 = &local_1090;
  local_1098 = 0;
  local_1090 = 0;
  DVar9 = sd->storage_;
  pSVar11 = sd->snapshotMan_->currentSnapshot_;
  lVar12 = (long)sd->localIndex_;
  lVar8 = *(long *)((long)&(pSVar11->atomData).position.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + DVar9);
  uVar1 = *(ulong *)(lVar8 + lVar12 * 0x18);
  uVar2 = *(ulong *)(lVar8 + 8 + lVar12 * 0x18);
  uVar3 = *(ulong *)(lVar8 + 0x10 + lVar12 * 0x18);
  if (0x7fefffffffffffff < (uVar3 & 0x7fffffffffffffff) ||
      (0x7fefffffffffffff < (uVar2 & 0x7fffffffffffffff) ||
      0x7fefffffffffffff < (uVar1 & 0x7fffffffffffffff))) {
    snprintf(painCave.errMsg,2000,
             "DumpWriter detected a numerical error writing the position for object %d",(ulong)uVar7
            );
    painCave.isFatal = 1;
    simError();
    DVar9 = sd->storage_;
    pSVar11 = sd->snapshotMan_->currentSnapshot_;
    lVar12 = (long)sd->localIndex_;
  }
  lVar8 = *(long *)((long)&(pSVar11->atomData).velocity.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + DVar9);
  uVar4 = *(ulong *)(lVar8 + lVar12 * 0x18);
  uVar5 = *(ulong *)(lVar8 + 8 + lVar12 * 0x18);
  uVar6 = *(ulong *)(lVar8 + 0x10 + lVar12 * 0x18);
  if (0x7fefffffffffffff < (uVar6 & 0x7fffffffffffffff) ||
      (0x7fefffffffffffff < (uVar5 & 0x7fffffffffffffff) ||
      0x7fefffffffffffff < (uVar4 & 0x7fffffffffffffff))) {
    snprintf(painCave.errMsg,2000,
             "DumpWriter detected a numerical error writing the velocity for object %d",(ulong)uVar7
            );
    painCave.isFatal = 1;
    simError();
  }
  snprintf(local_1038,0x1000,"%18.10g %18.10g %18.10g %13e %13e %13e",uVar1,uVar2,uVar3,uVar4,uVar5,
           uVar6);
  std::__cxx11::string::append((char *)&local_10a0);
  if (sd->objType_ - otDAtom < 2) {
    std::__cxx11::string::append((char *)local_1080);
    SquareMatrix3<double>::toQuaternion
              (&local_1058,
               (SquareMatrix3<double> *)
               ((long)sd->localIndex_ * 0x48 +
               *(long *)((long)&(sd->snapshotMan_->currentSnapshot_->atomData).aMat.
                                super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + sd->storage_)));
    if ((0x7fefffffffffffff < (ulong)ABS(local_1058.super_Vector<double,_4U>.data_[3]) ||
        0x7fefffffffffffff < (ulong)ABS(local_1058.super_Vector<double,_4U>.data_[2])) ||
        (0x7fefffffffffffff < (ulong)ABS(local_1058.super_Vector<double,_4U>.data_[1]) ||
        0x7fefffffffffffff < (ulong)ABS(local_1058.super_Vector<double,_4U>.data_[0]))) {
      snprintf(painCave.errMsg,2000,
               "DumpWriter detected a numerical error writing the quaternion for object %d",
               (ulong)uVar7);
      painCave.isFatal = 1;
      simError();
    }
    lVar12 = (long)sd->localIndex_;
    lVar8 = *(long *)((long)&(sd->snapshotMan_->currentSnapshot_->atomData).angularMomentum.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + sd->storage_);
    uVar1 = *(ulong *)(lVar8 + lVar12 * 0x18);
    uVar2 = *(ulong *)(lVar8 + 8 + lVar12 * 0x18);
    uVar3 = *(ulong *)(lVar8 + 0x10 + lVar12 * 0x18);
    if (0x7fefffffffffffff < (uVar3 & 0x7fffffffffffffff) ||
        (0x7fefffffffffffff < (uVar2 & 0x7fffffffffffffff) ||
        0x7fefffffffffffff < (uVar1 & 0x7fffffffffffffff))) {
      local_1060 = uVar3;
      snprintf(painCave.errMsg,2000,
               "DumpWriter detected a numerical error writing the angular momentum for object %d",
               (ulong)uVar7);
      painCave.isFatal = 1;
      simError();
      uVar3 = local_1060;
    }
    snprintf(local_1038,0x1000," %13e %13e %13e %13e %13e %13e %13e",
             local_1058.super_Vector<double,_4U>.data_[0],
             local_1058.super_Vector<double,_4U>.data_[1],
             local_1058.super_Vector<double,_4U>.data_[2],
             local_1058.super_Vector<double,_4U>.data_[3],uVar1,uVar2,uVar3);
    std::__cxx11::string::append((char *)&local_10a0);
  }
  if (this->needForceVector_ == true) {
    std::__cxx11::string::append((char *)local_1080);
    lVar12 = (long)sd->localIndex_;
    lVar8 = *(long *)((long)&(sd->snapshotMan_->currentSnapshot_->atomData).force.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + sd->storage_);
    uVar1 = *(ulong *)(lVar8 + lVar12 * 0x18);
    uVar2 = *(ulong *)(lVar8 + 8 + lVar12 * 0x18);
    uVar3 = *(ulong *)(lVar8 + 0x10 + lVar12 * 0x18);
    if (0x7fefffffffffffff < (uVar3 & 0x7fffffffffffffff) ||
        (0x7fefffffffffffff < (uVar2 & 0x7fffffffffffffff) ||
        0x7fefffffffffffff < (uVar1 & 0x7fffffffffffffff))) {
      snprintf(painCave.errMsg,2000,
               "DumpWriter detected a numerical error writing the force for object %d",(ulong)uVar7)
      ;
      painCave.isFatal = 1;
      simError();
    }
    snprintf(local_1038,0x1000," %13e %13e %13e",uVar1,uVar2,uVar3);
    std::__cxx11::string::append((char *)&local_10a0);
    if (sd->objType_ - otDAtom < 2) {
      std::__cxx11::string::append((char *)local_1080);
      lVar12 = (long)sd->localIndex_;
      lVar8 = *(long *)((long)&(sd->snapshotMan_->currentSnapshot_->atomData).torque.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + sd->storage_);
      uVar1 = *(ulong *)(lVar8 + lVar12 * 0x18);
      uVar2 = *(ulong *)(lVar8 + 8 + lVar12 * 0x18);
      uVar3 = *(ulong *)(lVar8 + 0x10 + lVar12 * 0x18);
      if (0x7fefffffffffffff < (uVar3 & 0x7fffffffffffffff) ||
          (0x7fefffffffffffff < (uVar2 & 0x7fffffffffffffff) ||
          0x7fefffffffffffff < (uVar1 & 0x7fffffffffffffff))) {
        snprintf(painCave.errMsg,2000,
                 "DumpWriter detected a numerical error writing the torque for object %d",
                 (ulong)uVar7);
        painCave.isFatal = 1;
        simError();
      }
      snprintf(local_1038,0x1000," %13e %13e %13e",uVar1,uVar2,uVar3);
      std::__cxx11::string::append((char *)&local_10a0);
    }
  }
  snprintf(local_1038,0x1000,"%10d %7s %s\n",(ulong)uVar7,local_1080[0],local_10a0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar10 = strlen(local_1038);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_1038,local_1038 + sVar10);
  if (local_10a0 != &local_1090) {
    operator_delete(local_10a0,CONCAT71(uStack_108f,local_1090) + 1);
  }
  if (local_1080[0] != local_1070) {
    operator_delete(local_1080[0],local_1070[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DumpWriter::prepareDumpLine(StuntDouble* sd) {
    int index = sd->getGlobalIntegrableObjectIndex();
    std::string type("pv");
    std::string line;
    char tempBuffer[4096];

    Vector3d pos;
    Vector3d vel;
    pos = sd->getPos();

    if (std::isinf(pos[0]) || std::isnan(pos[0]) || std::isinf(pos[1]) ||
        std::isnan(pos[1]) || std::isinf(pos[2]) || std::isnan(pos[2])) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DumpWriter detected a numerical error writing the position"
               " for object %d",
               index);
      painCave.isFatal = 1;
      simError();
    }

    vel = sd->getVel();

    if (std::isinf(vel[0]) || std::isnan(vel[0]) || std::isinf(vel[1]) ||
        std::isnan(vel[1]) || std::isinf(vel[2]) || std::isnan(vel[2])) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DumpWriter detected a numerical error writing the velocity"
               " for object %d",
               index);
      painCave.isFatal = 1;
      simError();
    }

    snprintf(tempBuffer, 4096, "%18.10g %18.10g %18.10g %13e %13e %13e", pos[0],
             pos[1], pos[2], vel[0], vel[1], vel[2]);
    line += tempBuffer;

    if (sd->isDirectional()) {
      type += "qj";
      Quat4d q;
      Vector3d ji;
      q = sd->getQ();

      if (std::isinf(q[0]) || std::isnan(q[0]) || std::isinf(q[1]) ||
          std::isnan(q[1]) || std::isinf(q[2]) || std::isnan(q[2]) ||
          std::isinf(q[3]) || std::isnan(q[3])) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "DumpWriter detected a numerical error writing the quaternion"
                 " for object %d",
                 index);
        painCave.isFatal = 1;
        simError();
      }

      ji = sd->getJ();

      if (std::isinf(ji[0]) || std::isnan(ji[0]) || std::isinf(ji[1]) ||
          std::isnan(ji[1]) || std::isinf(ji[2]) || std::isnan(ji[2])) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "DumpWriter detected a numerical error writing the angular"
                 " momentum for object %d",
                 index);
        painCave.isFatal = 1;
        simError();
      }

      snprintf(tempBuffer, 4096, " %13e %13e %13e %13e %13e %13e %13e", q[0],
               q[1], q[2], q[3], ji[0], ji[1], ji[2]);
      line += tempBuffer;
    }

    if (needForceVector_) {
      type += "f";
      Vector3d frc = sd->getFrc();
      if (std::isinf(frc[0]) || std::isnan(frc[0]) || std::isinf(frc[1]) ||
          std::isnan(frc[1]) || std::isinf(frc[2]) || std::isnan(frc[2])) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "DumpWriter detected a numerical error writing the force"
                 " for object %d",
                 index);
        painCave.isFatal = 1;
        simError();
      }
      snprintf(tempBuffer, 4096, " %13e %13e %13e", frc[0], frc[1], frc[2]);
      line += tempBuffer;

      if (sd->isDirectional()) {
        type += "t";
        Vector3d trq = sd->getTrq();
        if (std::isinf(trq[0]) || std::isnan(trq[0]) || std::isinf(trq[1]) ||
            std::isnan(trq[1]) || std::isinf(trq[2]) || std::isnan(trq[2])) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "DumpWriter detected a numerical error writing the torque"
                   " for object %d",
                   index);
          painCave.isFatal = 1;
          simError();
        }
        snprintf(tempBuffer, 4096, " %13e %13e %13e", trq[0], trq[1], trq[2]);
        line += tempBuffer;
      }
    }

    snprintf(tempBuffer, 4096, "%10d %7s %s\n", index, type.c_str(),
             line.c_str());
    return std::string(tempBuffer);
  }